

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_misc_functions.cc
# Opt level: O0

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
draco::CreateCornerTableFromAttribute(Mesh *mesh,Type type)

{
  bool bVar1;
  reference this;
  CornerTable *in_RDI;
  int j;
  Face *face;
  FaceIndex i;
  FaceType new_face;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  faces;
  PointAttribute *att;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  PointCloud *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  PointAttribute *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  _Head_base<0UL,_draco::CornerTable_*,_false> faces_00;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  Face *local_68;
  ValueType local_5c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_58 [14];
  PointAttribute *local_20;
  
  faces_00._M_head_impl = in_RDI;
  local_20 = PointCloud::GetNamedAttribute(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (local_20 == (PointAttribute *)0x0) {
    std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
    unique_ptr<std::default_delete<draco::CornerTable>,void>
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               in_stack_ffffffffffffff40,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    Mesh::num_faces((Mesh *)0x192812);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
    ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                       *)in_RDI,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::array
              ((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
               in_stack_ffffffffffffff50);
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_58,0);
    while( true ) {
      local_5c = Mesh::num_faces((Mesh *)0x19284f);
      bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_58,&local_5c);
      if (!bVar1) break;
      local_6c = local_58[0].value_;
      local_68 = Mesh::face((Mesh *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            (FaceIndex)(uint)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
        in_stack_ffffffffffffff50 = local_20;
        std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                  ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                   in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_78.value_ =
             (uint)PointAttribute::mapped_index
                             ((PointAttribute *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              (uint)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff4c =
             IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_78);
        local_74 = in_stack_ffffffffffffff4c;
        this = std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::
               operator[]((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>
                           *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(this,&local_74);
      }
      in_stack_ffffffffffffff40 =
           (PointCloud *)
           IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
           ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                         *)in_stack_ffffffffffffff40,
                        (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::operator=
                ((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
                 in_stack_ffffffffffffff50,
                 (array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_58);
    }
    CornerTable::Create((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                         *)faces_00._M_head_impl);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
    ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                        *)0x1929cb);
  }
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
         faces_00._M_head_impl;
}

Assistant:

std::unique_ptr<CornerTable> CreateCornerTableFromAttribute(
    const Mesh *mesh, GeometryAttribute::Type type) {
  typedef CornerTable::FaceType FaceType;

  const PointAttribute *const att = mesh->GetNamedAttribute(type);
  if (att == nullptr) {
    return nullptr;
  }
  IndexTypeVector<FaceIndex, FaceType> faces(mesh->num_faces());
  FaceType new_face;
  for (FaceIndex i(0); i < mesh->num_faces(); ++i) {
    const Mesh::Face &face = mesh->face(i);
    for (int j = 0; j < 3; ++j) {
      // Map general vertex indices to attribute indices.
      new_face[j] = att->mapped_index(face[j]).value();
    }
    faces[FaceIndex(i)] = new_face;
  }
  // Build the corner table.
  return CornerTable::Create(faces);
}